

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateCFBundle
          (cmOSXBundleGenerator *this,string *targetName,string *root,string *config)

{
  bool bVar1;
  undefined1 local_1a0 [8];
  string name;
  cmAlphaNum local_160;
  cmAlphaNum local_130;
  undefined1 local_100 [8];
  string plist;
  string local_c8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string out;
  string *config_local;
  string *root_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = config;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_78,root);
    cmAlphaNum::cmAlphaNum(&local_a8,'/');
    cmGeneratorTarget::GetCFBundleDirectory
              (&local_c8,this->GT,(string *)out.field_2._8_8_,FullLevel);
    cmStrCat<std::__cxx11::string>((string *)local_48,&local_78,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    register0x00000000 = cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_48);
    cmAlphaNum::cmAlphaNum(&local_130,root);
    cmAlphaNum::cmAlphaNum(&local_160,'/');
    cmGeneratorTarget::GetCFBundleDirectory
              ((string *)((long)&name.field_2 + 8),this->GT,(string *)out.field_2._8_8_,ContentLevel
              );
    cmStrCat<std::__cxx11::string,char[12]>
              ((string *)local_100,&local_130,&local_160,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&name.field_2 + 8),(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    cmsys::SystemTools::GetFilenameName((string *)local_1a0,targetName);
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,(string *)local_1a0,(string *)local_100);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_100);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateCFBundle(const std::string& targetName,
                                          const std::string& root,
                                          const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    root, '/',
    this->GT->GetCFBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, name, plist);
  this->Makefile->AddCMakeOutputFile(plist);
}